

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v6::internal::format_error_code
          (internal *this,buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  size_t sVar2;
  iterator iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_00000014;
  uint value;
  uint uVar7;
  buffer<char> *c;
  writer w;
  basic_writer<fmt::v6::buffer_range<char>_> local_30;
  
  pcVar5 = message.data_;
  value = (uint)out;
  *(undefined8 *)(this + 0x10) = 0;
  uVar4 = -value;
  if (0 < (int)value) {
    uVar4 = value;
  }
  uVar7 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  local_30.locale_.locale_ = (void *)0x0;
  pcVar6 = (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) +
                            (ulong)((uVar7 - (uVar4 < *(uint *)(basic_data<void>::
                                                                zero_or_powers_of_10_32 +
                                                               (ulong)uVar7 * 4))) + 1)));
  local_30.out_.container = (buffer<char> *)this;
  if (pcVar5 <= pcVar6) {
    if (*(char **)(this + 0x18) < pcVar5) {
      (*(code *)**(undefined8 **)this)
                (this,pcVar5,(void *)CONCAT44(in_register_00000014,error_code),pcVar6,message.size_)
      ;
    }
    *(char **)(this + 0x10) = pcVar5;
    if (pcVar5 != (char *)0x0) {
      memmove(*(void **)(this + 8),(void *)CONCAT44(in_register_00000014,error_code),(size_t)pcVar5)
      ;
    }
    iVar3.container = local_30.out_.container;
    sVar2 = (local_30.out_.container)->size_;
    uVar1 = sVar2 + 2;
    if ((local_30.out_.container)->capacity_ < uVar1) {
      (**(local_30.out_.container)->_vptr_buffer)(local_30.out_.container,uVar1);
    }
    (iVar3.container)->size_ = uVar1;
    pcVar5 = (iVar3.container)->ptr_ + sVar2;
    pcVar5[0] = ':';
    pcVar5[1] = ' ';
  }
  iVar3.container = local_30.out_.container;
  sVar2 = (local_30.out_.container)->size_;
  uVar1 = sVar2 + 6;
  if ((local_30.out_.container)->capacity_ < uVar1) {
    (**(local_30.out_.container)->_vptr_buffer)(local_30.out_.container,uVar1);
  }
  (iVar3.container)->size_ = uVar1;
  builtin_strncpy((iVar3.container)->ptr_ + sVar2,"error ",6);
  basic_writer<fmt::v6::buffer_range<char>_>::write_decimal<int>(&local_30,value);
  return;
}

Assistant:

FMT_FUNC void format_error_code(internal::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  internal::writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}